

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-wrap.cpp
# Opt level: O1

bool get_current_dms_text_descriptor(MXFWriter *writer,GenericStreamTextBasedSet **text_object)

{
  long ****pppplVar1;
  long ****pppplVar2;
  long ***ppplVar3;
  MDD_t MVar4;
  long *plVar5;
  undefined8 uVar6;
  GenericStreamTextBasedSet *pGVar7;
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  object_list;
  long ***local_a0;
  long ***local_98;
  undefined8 local_90;
  Result_t local_88 [104];
  
  local_a0 = (long ***)&local_a0;
  local_90 = 0;
  local_98 = local_a0;
  plVar5 = (long *)(**(code **)(*(long *)writer + 0x10))();
  MVar4 = ASDCP::DefaultSMPTEDict();
  uVar6 = ASDCP::Dictionary::Type(MVar4);
  (**(code **)(*plVar5 + 0xb0))(local_88,plVar5,uVar6,&local_a0);
  Kumu::Result_t::~Result_t(local_88);
  ppplVar3 = local_a0;
  if ((long ****)local_a0 != &local_a0) {
    if ((long ***)local_98[2] == (long ***)0x0) {
      pGVar7 = (GenericStreamTextBasedSet *)0x0;
    }
    else {
      pGVar7 = (GenericStreamTextBasedSet *)
               __dynamic_cast(local_98[2],&ASDCP::MXF::InterchangeObject::typeinfo,
                              &ASDCP::MXF::GenericStreamTextBasedSet::typeinfo,0);
    }
    *text_object = pGVar7;
    pppplVar2 = (long ****)ppplVar3;
    if (pGVar7 == (GenericStreamTextBasedSet *)0x0) {
      __assert_fail("text_object != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-wrap.cpp"
                    ,0x708,
                    "bool get_current_dms_text_descriptor(AS_02::ISXD::MXFWriter &, ASDCP::MXF::GenericStreamTextBasedSet *&)"
                   );
    }
    while (pppplVar2 != &local_a0) {
      pppplVar1 = (long ****)*pppplVar2;
      operator_delete(pppplVar2,0x18);
      pppplVar2 = pppplVar1;
    }
  }
  return (long ****)ppplVar3 != &local_a0;
}

Assistant:

bool
get_current_dms_text_descriptor(AS_02::ISXD::MXFWriter& writer, ASDCP::MXF::GenericStreamTextBasedSet *&text_object)
{
  std::list<MXF::InterchangeObject*> object_list;
  writer.OP1aHeader().GetMDObjectsByType(DefaultSMPTEDict().ul(MDD_GenericStreamTextBasedSet), object_list);

  if ( object_list.empty() )
    {
      return false;
    }

  text_object = dynamic_cast<MXF::GenericStreamTextBasedSet*>(object_list.back());
  assert(text_object != 0);
  return true;
}